

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

parser_error parse_trap_effect_xtra(parser *p)

{
  long *plVar1;
  parser_error pVar2;
  void *pvVar3;
  effect *effect;
  long *plVar4;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    return PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  effect = (effect *)mem_zalloc(0x38);
  plVar1 = *(long **)((long)pvVar3 + 0x78);
  if (*(long **)((long)pvVar3 + 0x78) == (long *)0x0) {
    plVar4 = (long *)((long)pvVar3 + 0x78);
  }
  else {
    do {
      plVar4 = plVar1;
      plVar1 = (long *)*plVar4;
    } while ((long *)*plVar4 != (long *)0x0);
  }
  *plVar4 = (long)effect;
  pVar2 = grab_effect_data(p,effect);
  return pVar2;
}

Assistant:

static enum parser_error parse_trap_effect_xtra(struct parser *p) {
	struct trap_kind *t = parser_priv(p);
	struct effect *effect, *new_effect;

	if (!t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/* Go to the next vacant effect and set it to the new one  */
	new_effect = mem_zalloc(sizeof(*new_effect));
	if (t->effect_xtra) {
		effect = t->effect_xtra;
		while (effect->next) effect = effect->next;
		effect->next = new_effect;
	} else {
		t->effect_xtra = new_effect;
	}
	/* Fill in the detail */
	return grab_effect_data(p, new_effect);
}